

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3TruncateNode(char *aNode,int nNode,Blob *pNew,char *zTerm,int nTerm,sqlite3_int64 *piBlock)

{
  uint uVar1;
  uint uVar2;
  undefined8 in_RCX;
  char *in_RDX;
  int in_ESI;
  Blob *in_RDI;
  undefined4 in_R8D;
  NodeReader *in_R9;
  long in_FS_OFFSET;
  bool bVar3;
  int res;
  int bLeaf;
  int rc;
  Blob prev;
  NodeReader reader;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  int local_58;
  int local_54;
  undefined1 local_50 [16];
  long local_40 [2];
  char *local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_40,0xaa,0x38);
  memset(local_50,0,0x10);
  if (in_ESI < 1) {
    local_58 = 0x10b;
  }
  else {
    bVar3 = *(char *)&in_RDI->a == '\0';
    uVar2 = (uint)bVar3;
    blobGrowBuffer((Blob *)CONCAT44(in_R8D,in_stack_ffffffffffffff80),(int)((ulong)in_R9 >> 0x20),
                   (int *)(ulong)CONCAT14(bVar3,in_stack_ffffffffffffff70));
    in_RDX[8] = '\0';
    in_RDX[9] = '\0';
    in_RDX[10] = '\0';
    in_RDX[0xb] = '\0';
    local_54 = nodeReaderInit((NodeReader *)CONCAT44(uVar2,in_stack_ffffffffffffff70),
                              (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              0);
    while( true ) {
      uVar1 = in_stack_ffffffffffffff6c & 0xffffff;
      if (local_54 == 0) {
        uVar1 = CONCAT13(local_40[0] != 0,(int3)in_stack_ffffffffffffff6c);
      }
      in_stack_ffffffffffffff6c = uVar1;
      if ((char)(in_stack_ffffffffffffff6c >> 0x18) == '\0') break;
      if (*(int *)(in_RDX + 8) == 0) {
        in_stack_ffffffffffffff70 =
             fts3TermCmp((char *)CONCAT44(in_R8D,in_stack_ffffffffffffff80),
                         (int)((ulong)in_R9 >> 0x20),
                         (char *)CONCAT44(uVar2,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
                        );
        if ((-1 < in_stack_ffffffffffffff70) && ((uVar2 != 0 || (in_stack_ffffffffffffff70 != 0))))
        {
          fts3StartNode((Blob *)CONCAT44(uVar2,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c,
                        0x25bd8a);
          in_R9->aNode = local_30;
          goto LAB_0025bd97;
        }
      }
      else {
LAB_0025bd97:
        local_54 = fts3AppendToNode(in_RDI,(Blob *)CONCAT44(in_ESI,in_stack_ffffffffffffff98),in_RDX
                                    ,(int)((ulong)in_RCX >> 0x20),
                                    (char *)CONCAT44(in_R8D,in_stack_ffffffffffffff80),
                                    (int)((ulong)in_R9 >> 0x20));
        if (local_54 != 0) break;
      }
      local_54 = nodeReaderNext(in_R9);
    }
    if (*(int *)(in_RDX + 8) == 0) {
      fts3StartNode((Blob *)CONCAT44(uVar2,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c,
                    0x25be03);
      in_R9->aNode = local_30;
    }
    nodeReaderRelease((NodeReader *)0x25be1a);
    sqlite3_free((void *)0x25be24);
    local_58 = local_54;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_58;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3TruncateNode(
  const char *aNode,              /* Current node image */
  int nNode,                      /* Size of aNode in bytes */
  Blob *pNew,                     /* OUT: Write new node image here */
  const char *zTerm,              /* Omit all terms smaller than this */
  int nTerm,                      /* Size of zTerm in bytes */
  sqlite3_int64 *piBlock          /* OUT: Block number in next layer down */
){
  NodeReader reader;              /* Reader object */
  Blob prev = {0, 0, 0};          /* Previous term written to new node */
  int rc = SQLITE_OK;             /* Return code */
  int bLeaf;                       /* True for a leaf node */

  if( nNode<1 ) return FTS_CORRUPT_VTAB;
  bLeaf = aNode[0]=='\0';

  /* Allocate required output space */
  blobGrowBuffer(pNew, nNode, &rc);
  if( rc!=SQLITE_OK ) return rc;
  pNew->n = 0;

  /* Populate new node buffer */
  for(rc = nodeReaderInit(&reader, aNode, nNode);
      rc==SQLITE_OK && reader.aNode;
      rc = nodeReaderNext(&reader)
  ){
    if( pNew->n==0 ){
      int res = fts3TermCmp(reader.term.a, reader.term.n, zTerm, nTerm);
      if( res<0 || (bLeaf==0 && res==0) ) continue;
      fts3StartNode(pNew, (int)aNode[0], reader.iChild);
      *piBlock = reader.iChild;
    }
    rc = fts3AppendToNode(
        pNew, &prev, reader.term.a, reader.term.n,
        reader.aDoclist, reader.nDoclist
    );
    if( rc!=SQLITE_OK ) break;
  }
  if( pNew->n==0 ){
    fts3StartNode(pNew, (int)aNode[0], reader.iChild);
    *piBlock = reader.iChild;
  }
  assert( pNew->n<=pNew->nAlloc );

  nodeReaderRelease(&reader);
  sqlite3_free(prev.a);
  return rc;
}